

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.hh
# Opt level: O0

void __thiscall
tchecker::pool_t<tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_>::free_all
          (pool_t<tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_> *this)

{
  char *pcVar1;
  void **ppvVar2;
  void *tmp;
  void *p;
  pool_t<tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_> *this_local;
  
  pcVar1 = this->_block_head;
  while (tmp = pcVar1, tmp != (void *)0x0) {
    ppvVar2 = nextblock(tmp);
    pcVar1 = (char *)*ppvVar2;
    if (tmp != (void *)0x0) {
      operator_delete__(tmp);
    }
  }
  this->_blocks_count = 0;
  this->_free_head = (char *)0x0;
  this->_block_head = (char *)0x0;
  this->_raw_head = (char *)0x0;
  this->_raw_end = (char *)0x0;
  return;
}

Assistant:

void free_all()
  {
    void *p = _block_head, *tmp = nullptr;
    while (p != nullptr) {
      tmp = p;
      p = nextblock(p);
      delete[] static_cast<char *>(tmp);
    }
    _blocks_count = 0;
    _free_head = nullptr; // _free_head_lock access protection useless
    _block_head = nullptr;
    _raw_head = nullptr;
    _raw_end = nullptr;
  }